

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RangeCoverageBinInitializerSyntax::setChild
          (RangeCoverageBinInitializerSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  WithClauseSyntax *pWVar2;
  RangeListSyntax *pRVar3;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (index == 0) {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pRVar3 = (RangeListSyntax *)0x0;
    }
    else {
      pRVar3 = (RangeListSyntax *)TokenOrSyntax::node(&child);
    }
    (this->ranges).ptr = pRVar3;
  }
  else {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pWVar2 = (WithClauseSyntax *)0x0;
    }
    else {
      pWVar2 = (WithClauseSyntax *)TokenOrSyntax::node(&child);
    }
    this->withClause = pWVar2;
  }
  return;
}

Assistant:

void RangeCoverageBinInitializerSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        case 1: withClause = child.node() ? &child.node()->as<WithClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}